

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O2

void __thiscall amrex::TagBox::tags(TagBox *this,Vector<int,_std::allocator<int>_> *ar)

{
  int iVar1;
  pointer piVar2;
  char *pcVar3;
  pointer piVar4;
  int i;
  long lVar5;
  
  pcVar3 = BaseFab<char>::dataPtr(&this->super_BaseFab<char>,0);
  piVar2 = (ar->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar4 = piVar2;
  for (lVar5 = 0;
      lVar5 < (long)(ar->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish - (long)piVar4 >> 2; lVar5 = lVar5 + 1) {
    iVar1 = piVar2[lVar5];
    if (iVar1 != 0) {
      pcVar3[lVar5] = (char)iVar1;
      piVar4 = (ar->super_vector<int,_std::allocator<int>_>).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
    }
  }
  return;
}

Assistant:

void
TagBox::tags (const Vector<int>& ar) noexcept
{
    BL_ASSERT(ar.size() == domain.numPts());

    TagType*   cptr = dataPtr();
    const int* iptr = ar.dataPtr();

    for (int i = 0; i < ar.size(); i++, cptr++, iptr++)
    {
        if (*iptr)
            *cptr = *iptr;
    }
}